

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QUnicodeTables::detachAndConvertCase<QString_const>
          (QString *__return_storage_ptr__,QUnicodeTables *this,QString *str,QStringIterator it,
          Case which)

{
  char16_t cVar1;
  Data *pDVar2;
  ulong uVar3;
  char16_t *pcVar4;
  ulong uVar5;
  qsizetype blen;
  char cVar6;
  char32_t uc;
  char16_t *pcVar7;
  long lVar8;
  char16_t *pcVar9;
  const_iterator pQVar10;
  long in_FS_OFFSET;
  QSpan<unsigned_long,_18446744073709551615UL> indices;
  R_conflict2 RVar11;
  QStringView after;
  ulong local_50;
  char16_t local_48 [4];
  undefined2 local_40;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  pDVar2 = *(Data **)this;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = *(char16_t **)(this + 8);
  (__return_storage_ptr__->d).size = *(qsizetype *)(this + 0x10);
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pDVar2 = (__return_storage_ptr__->d).d;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2))
    goto LAB_0012a585;
  }
  QString::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
LAB_0012a585:
  pcVar9 = (__return_storage_ptr__->d).ptr;
  pcVar7 = (char16_t *)(((long)it.pos - (long)it.i) + (long)pcVar9);
  do {
    pQVar10 = it.pos + 1;
    local_48 = (char16_t  [4])&DAT_aaaaaaaaaaaaaaaa;
    local_40 = 0xaaaa;
    cVar1 = (it.pos)->ucs;
    uc = (char32_t)(ushort)cVar1;
    if (((((cVar1 & 0xf800U) == 0xd800) && (uc = L'�', (cVar1 & 0xdc00U) == 0xd800)) &&
        (pQVar10 < it.e)) && (pcVar4 = &pQVar10->ucs, (*pcVar4 & 0xfc00U) == 0xdc00)) {
      pQVar10 = it.pos + 2;
      uc = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)*pcVar4 + L'\xfca02400';
    }
    RVar11 = fullConvertCase(uc,(Case)str);
    cVar6 = RVar11.sz;
    local_48 = RVar11.chars;
    local_40 = CONCAT11(local_40._1_1_,cVar6);
    if (cVar6 < '\x02') {
      *pcVar7 = RVar11.chars[0];
      pcVar7 = pcVar7 + 1;
    }
    else if ((cVar6 == '\x02') && (*pcVar7 == RVar11.chars[0])) {
      pcVar7[1] = RVar11.chars[1];
      pcVar7 = pcVar7 + 2;
    }
    else {
      lVar8 = (long)pcVar7 - (long)pcVar9;
      uVar5 = lVar8 >> 1;
      uVar3 = (__return_storage_ptr__->d).size;
      blen = uVar3 - uVar5;
      if (uVar5 <= uVar3) {
        if (0 < blen) {
          blen = 1;
        }
        indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size = 1;
        indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data = &local_50;
        after.m_size._0_1_ = cVar6;
        after.m_data = local_48;
        after.m_size._1_7_ = 0;
        local_50 = uVar5;
        replace_helper(__return_storage_ptr__,indices,blen,after);
        pcVar9 = (__return_storage_ptr__->d).ptr;
        cVar6 = (char)local_40;
      }
      pcVar7 = (char16_t *)((long)pcVar9 + (long)cVar6 * 2 + lVar8);
    }
    it.pos = pQVar10;
  } while (pQVar10 < it.e);
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

Q_NEVER_INLINE
static QString detachAndConvertCase(T &str, QStringIterator it, QUnicodeTables::Case which)
{
    Q_ASSERT(!str.isEmpty());
    QString s = std::move(str);         // will copy if T is const QString
    QChar *pp = s.begin() + it.index(); // will detach if necessary

    do {
        const auto folded = fullConvertCase(it.next(), which);
        if (Q_UNLIKELY(folded.size() > 1)) {
            if (folded.chars[0] == *pp && folded.size() == 2) {
                // special case: only second actually changed (e.g. surrogate pairs),
                // avoid slow case
                ++pp;
                *pp++ = folded.chars[1];
            } else {
                // slow path: the string is growing
                qsizetype inpos = it.index() - 1;
                qsizetype outpos = pp - s.constBegin();

                s.replace(outpos, 1, reinterpret_cast<const QChar *>(folded.data()), folded.size());
                pp = const_cast<QChar *>(s.constBegin()) + outpos + folded.size();

                // Adjust the input iterator if we are performing an in-place conversion
                if constexpr (!std::is_const<T>::value)
                    it = QStringIterator(s.constBegin(), inpos + folded.size(), s.constEnd());
            }
        } else {
            *pp++ = folded.chars[0];
        }
    } while (it.hasNext());

    return s;
}